

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

void __thiscall
rsg::ComputeAddRange::operator()
          (ComputeAddRange *this,Random *random,int dstMin,int dstMax,int *aMin,int *aMax,int *bMin,
          int *bMax)

{
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  
  iVar1 = de::Random::getInt(random,0,dstMax - dstMin);
  dVar2 = deRandom_getUint32(&random->m_rnd);
  uVar3 = dVar2 % 0x11;
  *aMin = uVar3 + dstMin + -8;
  *aMax = iVar1 + -8 + uVar3 + dstMin;
  *bMin = 8 - uVar3;
  *bMax = ((dstMax - dstMin) - (iVar1 + uVar3)) + 8;
  return;
}

Assistant:

void ComputeAddRange::operator() (de::Random& random, T dstMin, T dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& rnd, int min, int max) const		{ return rnd.getInt(min, max); }
		float	operator() (de::Random& rnd, float min, float max) const	{ return getQuantizedFloat(rnd, min, max, 0.5f); }
	};

	T rangeLen		= dstMax-dstMin;
	T subRangeLen	= GetRandom()(random, T(0), rangeLen);
	T aOffset		= GetRandom()(random, T(-8), T(8));

	aMin			= dstMin+aOffset;
	aMax			= aMin+subRangeLen;

	bMin			= -aOffset;
	bMax			= -aOffset+(rangeLen-subRangeLen);

#if defined(DE_DEBUG)
	T eps = T(0.001);
	DE_ASSERT(aMin <= aMax && bMin <= bMax);
	DE_ASSERT(de::inRange(aMin+bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMin+bMax, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax+bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax+bMax, dstMin-eps, dstMax+eps));
#endif
}